

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLAttribute * __thiscall tinyxml2::XMLElement::CreateAttribute(XMLElement *this)

{
  XMLAttribute *this_00;
  XMLAttribute *attrib;
  XMLElement *this_local;
  
  this_00 = (XMLAttribute *)MemPoolT<80>::Alloc(&((this->super_XMLNode)._document)->_attributePool);
  XMLAttribute::XMLAttribute(this_00);
  this_00->_memPool = &(((this->super_XMLNode)._document)->_attributePool).super_MemPool;
  (*this_00->_memPool->_vptr_MemPool[5])();
  return this_00;
}

Assistant:

XMLAttribute* XMLElement::CreateAttribute()
{
    TIXMLASSERT(sizeof(XMLAttribute) == _document->_attributePool.ItemSize());
    XMLAttribute* attrib = new (_document->_attributePool.Alloc()) XMLAttribute();
    TIXMLASSERT(attrib);
    attrib->_memPool = &_document->_attributePool;
    attrib->_memPool->SetTracked();
    return attrib;
}